

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmemory.h
# Opt level: O1

void __thiscall
icu_63::MaybeStackArray<char,_40>::MaybeStackArray
          (MaybeStackArray<char,_40> *this,int32_t newCapacity)

{
  char *pcVar1;
  
  this->ptr = this->stackArray;
  this->capacity = 0x28;
  this->needToRelease = '\0';
  if (0x28 < newCapacity) {
    pcVar1 = (char *)uprv_malloc_63((ulong)(uint)newCapacity);
    if (pcVar1 != (char *)0x0) {
      if (this->needToRelease != '\0') {
        uprv_free_63(this->ptr);
      }
      this->ptr = pcVar1;
      this->capacity = newCapacity;
      this->needToRelease = '\x01';
    }
  }
  return;
}

Assistant:

MaybeStackArray() : ptr(stackArray), capacity(stackCapacity), needToRelease(FALSE) {}